

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O3

void Abc_NtkGenFaultList(Abc_Ntk_t *pNtk,char *pFileName,int fStuckAt)

{
  Mio_Library_t *pLib;
  Abc_Obj_t *pObj;
  Mio_Gate_t *pGate;
  int iVar1;
  int iVar2;
  FILE *__stream;
  Vec_Ptr_t *pVVar3;
  char *pcVar4;
  Mio_Gate_t *pGate_00;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  pLib = (Mio_Library_t *)pNtk->pManFunc;
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",pFileName);
    return;
  }
  if ((pNtk->ntkFunc == ABC_FUNC_MAP) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    pVVar3 = pNtk->vObjs;
    if (pVVar3->nSize < 1) {
      uVar7 = 0;
    }
    else {
      uVar8 = 1;
      lVar6 = 0;
      do {
        pObj = (Abc_Obj_t *)pVVar3->pArray[lVar6];
        if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
          pGate = (Mio_Gate_t *)(pObj->field_5).pData;
          iVar1 = Mio_GateReadPinNum(pGate);
          pcVar4 = Abc_ObjName(pObj);
          iVar2 = (int)uVar8;
          fprintf(__stream,"%d %s %s\n",uVar8,pcVar4,"SA0");
          pcVar4 = Abc_ObjName(pObj);
          fprintf(__stream,"%d %s %s\n",(ulong)(iVar2 + 1),pcVar4,"SA1");
          pcVar4 = Abc_ObjName(pObj);
          fprintf(__stream,"%d %s %s\n",(ulong)(iVar2 + 2),pcVar4,"NEG");
          uVar8 = (ulong)(iVar2 + 3);
          if (fStuckAt == 0) {
            for (pGate_00 = Mio_LibraryReadGates(pLib); pGate_00 != (Mio_Gate_t *)0x0;
                pGate_00 = Mio_GateReadNext(pGate_00)) {
              if ((pGate_00 != pGate) && (iVar2 = Mio_GateReadPinNum(pGate_00), iVar2 == iVar1)) {
                pcVar4 = Abc_ObjName(pObj);
                pcVar5 = Mio_GateReadName(pGate_00);
                fprintf(__stream,"%d %s %s\n",uVar8,pcVar4,pcVar5);
                uVar8 = (ulong)((int)uVar8 + 1);
              }
            }
          }
        }
        lVar6 = lVar6 + 1;
        pVVar3 = pNtk->vObjs;
      } while (lVar6 < pVVar3->nSize);
      uVar7 = (int)uVar8 - 1;
    }
    pcVar4 = "stuck-at ";
    if (fStuckAt == 0) {
      pcVar4 = "";
    }
    printf("Generated fault list \"%s\" for network \"%s\" with %d nodes and %d %sfaults.\n",
           pFileName,pNtk->pName,(ulong)(uint)pNtk->nObjCounts[7],(ulong)uVar7,pcVar4);
    fclose(__stream);
    return;
  }
  __assert_fail("Abc_NtkIsMappedLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcDetect.c"
                ,0x4e,"void Abc_NtkGenFaultList(Abc_Ntk_t *, char *, int)");
}

Assistant:

void Abc_NtkGenFaultList( Abc_Ntk_t * pNtk, char * pFileName, int fStuckAt )
{
    Mio_Library_t * pLib = (Mio_Library_t *)pNtk->pManFunc;
    Mio_Gate_t * pGate;
    Abc_Obj_t * pObj;
    int i, Count = 1;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", pFileName );
        return;
    }
    assert( Abc_NtkIsMappedLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Mio_Gate_t * pGateObj = (Mio_Gate_t *)pObj->pData;
        int nInputs = Mio_GateReadPinNum(pGateObj);
        // add basic faults (SA0, SA1, NEG)
        fprintf( pFile, "%d %s %s\n", Count, Abc_ObjName(pObj), "SA0" ), Count++;
        fprintf( pFile, "%d %s %s\n", Count, Abc_ObjName(pObj), "SA1" ), Count++;
        fprintf( pFile, "%d %s %s\n", Count, Abc_ObjName(pObj), "NEG" ), Count++;
        if ( fStuckAt )
            continue;
        // add other faults, which correspond to changing the given gate
        // by another gate with the same support-size from the same library
        Mio_LibraryForEachGate( pLib, pGate )
            if ( pGate != pGateObj && Mio_GateReadPinNum(pGate) == nInputs )
                fprintf( pFile, "%d %s %s\n", Count, Abc_ObjName(pObj), Mio_GateReadName(pGate) ), Count++;
    }
    printf( "Generated fault list \"%s\" for network \"%s\" with %d nodes and %d %sfaults.\n", 
        pFileName, Abc_NtkName(pNtk), Abc_NtkNodeNum(pNtk), Count-1, fStuckAt ? "stuck-at ":"" );
    fclose( pFile );
}